

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
                *matrix,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>
  *pEVar5;
  node_ptr plVar6;
  node_ptr plVar7;
  undefined8 uVar8;
  Index IVar9;
  Chain_column_option CVar10;
  bool bVar11;
  node_ptr next;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  pointer ppEVar14;
  undefined4 local_334;
  undefined *local_330;
  undefined4 *local_328;
  undefined **local_320;
  undefined **local_318;
  ulong local_310;
  shared_count sStack_308;
  undefined4 **local_300;
  char *local_2f8;
  char *local_2f0;
  shared_count sStack_2e8;
  undefined **local_2e0;
  undefined1 local_2d8;
  undefined8 *local_2d0;
  undefined ***local_2c8;
  undefined4 **local_2c0;
  char *local_2b8;
  undefined **local_2b0;
  char *local_2a8;
  shared_count sStack_2a0;
  char *local_298;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *local_290;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
  *local_288;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
  moveCol;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
  col;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&col,(vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&col);
  build_column_values<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&col,(vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&col);
  local_288 = matrix;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>
  ::
  Naive_vector_column<std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>
              *)&col,(matrix->
                     super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  uVar8._4_4_ = moveCol._28_4_;
  uVar8._0_4_ = moveCol.super_Chain_column_option.pairedColumn_;
  p_Var12 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(rows->_M_t)._M_impl.super__Rb_tree_header;
  local_290 = rows;
  IVar9 = col.super_Row_access_option.columnIndex_;
  CVar10 = col.super_Chain_column_option;
  while ((_Rb_tree_header *)p_Var12 != p_Var1) {
    col.super_Row_access_option.columnIndex_ = IVar9;
    col.super_Chain_column_option = CVar10;
    moveCol._24_8_ = uVar8;
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var12[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_1a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_1a0 = "";
        local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x20d);
        local_310 = local_310 & 0xffffffffffffff00;
        local_318 = &PTR__lazy_ostream_001fd428;
        sStack_308.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_300 = (undefined4 **)0x1c32d4;
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_328 = (undefined4 *)CONCAT44(local_328._4_4_,iVar3);
        local_330 = (undefined *)CONCAT44(local_330._4_4_,6);
        local_2b0 = (undefined **)CONCAT71(local_2b0._1_7_,iVar3 == 6);
        local_2a8 = (char *)0x0;
        sStack_2a0.pi_ = (sp_counted_base *)0x0;
        local_2f8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_2f0 = "";
        local_2c0 = &local_328;
        moveCol.super_Row_access_option.rows_ =
             (Row_container *)((ulong)moveCol.super_Row_access_option.rows_ & 0xffffffffffffff00);
        moveCol.super_Row_access_option._0_8_ = &PTR__lazy_ostream_001fd8e8;
        moveCol.super_Column_dimension_option.dim_ = 0x205128;
        moveCol.super_Chain_column_option.pivot_ = 0;
        moveCol._24_8_ = &local_2c0;
        local_320 = &local_330;
        local_2d8 = 0;
        local_2e0 = &PTR__lazy_ostream_001fd928;
        local_2d0 = &boost::unit_test::lazy_ostream::inst;
        local_2c8 = &local_320;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2b0,&local_318,&local_2f8,0x20d,1,2,2,"entry.get_column_index()",&moveCol,
                   "6",&local_2e0);
        boost::detail::shared_count::~shared_count(&sStack_2a0);
      }
    }
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    IVar9 = col.super_Row_access_option.columnIndex_;
    CVar10 = col.super_Chain_column_option;
    uVar8 = moveCol._24_8_;
  }
  col.super_Row_access_option.columnIndex_ = 0;
  moveCol.super_Row_access_option.columnIndex_ = IVar9;
  col.super_Column_dimension_option.dim_ = -1;
  col.super_Chain_column_option.pivot_ = 0xffffffff;
  col.super_Chain_column_option.pairedColumn_ = 0xffffffff;
  moveCol.super_Chain_column_option.pivot_ = CVar10.pivot_;
  moveCol.super_Chain_column_option.pairedColumn_ = CVar10.pairedColumn_;
  moveCol.column_.
  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
  .super_type.m_holder.m_start =
       (pointer)&moveCol.column_.
                 super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                 .m_storage_start;
  moveCol.column_.
  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
  .super_type.m_holder.m_size = 0;
  moveCol.column_.
  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
  .super_type.m_holder.m_capacity = 8;
  moveCol.super_Row_access_option.rows_ = col.super_Row_access_option.rows_;
  boost::container::
  small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
  ::move_construct_impl
            (&moveCol.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
             ,(base_type *)&col.column_,(allocator_type *)&col.column_);
  moveCol.operators_._0_4_ = col.operators_._0_4_;
  moveCol.operators_._4_4_ = col.operators_._4_4_;
  moveCol.entryPool_._0_4_ = col.entryPool_._0_4_;
  moveCol.entryPool_._4_4_ = col.entryPool_._4_4_;
  col.operators_ = (Field_operators *)0x0;
  col.entryPool_ = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_2a8 = (char *)((ulong)local_2a8 & 0xffffffffffffff00);
  local_2b0 = &PTR__lazy_ostream_001fd428;
  sStack_2a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_320 = &local_330;
  local_330 = (undefined *)
              moveCol.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_328 = &local_334;
  local_334 = 4;
  local_2f0 = (char *)0x0;
  sStack_2e8.pi_ = (sp_counted_base *)0x0;
  local_2c0 = (undefined4 **)0x1c3e0d;
  local_2b8 = "";
  local_2c8 = &local_320;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fd3e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_328;
  local_310 = local_310 & 0xffffffffffffff00;
  local_318 = &PTR__lazy_ostream_001fd928;
  sStack_308.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2f8._0_1_ =
       moveCol.column_.
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
       .super_type.m_holder.m_size == 4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_2a8 = (char *)((ulong)local_2a8 & 0xffffffffffffff00);
  local_2b0 = &PTR__lazy_ostream_001fd428;
  sStack_2a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_330 = (undefined *)
              col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_2f8 = (char *)CONCAT71(local_2f8._1_7_,
                               col.column_.
                               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                               .super_type.m_holder.m_size == 0);
  local_334 = 0;
  local_2f0 = (char *)0x0;
  sStack_2e8.pi_ = (sp_counted_base *)0x0;
  local_2c0 = (undefined4 **)0x1c3e0d;
  local_2b8 = "";
  local_320 = &local_330;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fd3e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_320;
  local_328 = &local_334;
  local_310 = local_310 & 0xffffffffffffff00;
  local_318 = &PTR__lazy_ostream_001fd928;
  sStack_308.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f8,&local_2b0,&local_2c0,0x21d,1,2,2,"col.size()",&local_2e0,"0",&local_318);
  boost::detail::shared_count::~shared_count(&sStack_2e8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar11 = Gudhi::persistence_matrix::operator==
                     ((local_288->
                      super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&moveCol);
  local_318 = (undefined **)CONCAT71(local_318._1_7_,bVar11);
  local_310 = 0;
  sStack_308.pi_ = (sp_counted_base *)0x0;
  local_2b0 = (undefined **)0x1ce351;
  local_2a8 = "";
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fd370;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_2c8 = &local_2b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_308);
  for (p_Var12 = (local_290->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != p_Var1;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var12[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_1c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_1c0 = "";
        local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x225,
                   &local_1d8);
        local_2a8 = (char *)((ulong)local_2a8 & 0xffffffffffffff00);
        local_2b0 = &PTR__lazy_ostream_001fd428;
        sStack_2a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_298 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_330 = (undefined *)CONCAT44(local_330._4_4_,iVar3);
        local_334 = 6;
        local_2f8 = (char *)CONCAT71(local_2f8._1_7_,iVar3 == 6);
        local_2f0 = (char *)0x0;
        sStack_2e8.pi_ = (sp_counted_base *)0x0;
        local_2c0 = (undefined4 **)0x1c3e0d;
        local_2b8 = "";
        local_320 = &local_330;
        local_2d8 = 0;
        local_2e0 = &PTR__lazy_ostream_001fd8e8;
        local_2d0 = &boost::unit_test::lazy_ostream::inst;
        local_2c8 = &local_320;
        local_328 = &local_334;
        local_310 = local_310 & 0xffffffffffffff00;
        local_318 = &PTR__lazy_ostream_001fd928;
        sStack_308.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_300 = &local_328;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2f8,&local_2b0,&local_2c0,0x225,1,2,2,"entry.get_column_index()",
                   &local_2e0,"6",&local_318);
        boost::detail::shared_count::~shared_count(&sStack_2e8);
      }
    }
  }
  Gudhi::persistence_matrix::swap(&col,&moveCol);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_2a8 = (char *)((ulong)local_2a8 & 0xffffffffffffff00);
  local_2b0 = &PTR__lazy_ostream_001fd428;
  sStack_2a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_330 = (undefined *)
              moveCol.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_334 = 0;
  local_2f0 = (char *)0x0;
  sStack_2e8.pi_ = (sp_counted_base *)0x0;
  local_2c0 = (undefined4 **)0x1c3e0d;
  local_2b8 = "";
  local_320 = &local_330;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fd3e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_320;
  local_328 = &local_334;
  local_310 = local_310 & 0xffffffffffffff00;
  local_318 = &PTR__lazy_ostream_001fd928;
  sStack_308.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_300 = &local_328;
  local_2f8._0_1_ =
       moveCol.column_.
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
       .super_type.m_holder.m_size == 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e8);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_2a8 = (char *)((ulong)local_2a8 & 0xffffffffffffff00);
  local_2b0 = &PTR__lazy_ostream_001fd428;
  sStack_2a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_330 = (undefined *)
              col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_2f8 = (char *)CONCAT71(local_2f8._1_7_,
                               col.column_.
                               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                               .super_type.m_holder.m_size == 4);
  local_334 = 4;
  local_2f0 = (char *)0x0;
  sStack_2e8.pi_ = (sp_counted_base *)0x0;
  local_2c0 = (undefined4 **)0x1c3e0d;
  local_2b8 = "";
  local_320 = &local_330;
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fd3e8;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_320;
  local_328 = &local_334;
  local_310 = local_310 & 0xffffffffffffff00;
  local_318 = &PTR__lazy_ostream_001fd928;
  sStack_308.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f8,&local_2b0,&local_2c0,0x235,1,2,2,"col.size()",&local_2e0,"4",&local_318);
  boost::detail::shared_count::~shared_count(&sStack_2e8);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar11 = Gudhi::persistence_matrix::operator==
                     ((local_288->
                      super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&col);
  local_318 = (undefined **)CONCAT71(local_318._1_7_,bVar11);
  local_310 = 0;
  sStack_308.pi_ = (sp_counted_base *)0x0;
  local_2b0 = (undefined **)0x1ce366;
  local_2a8 = "";
  local_2d8 = 0;
  local_2e0 = &PTR__lazy_ostream_001fd370;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = &local_2b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_308);
  p_Var12 = (local_290->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  ppEVar14 = moveCol.column_.
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
             .super_type.m_holder.m_start;
  while (moveCol.column_.
         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
         .super_type.m_holder.m_start = ppEVar14, (_Rb_tree_header *)p_Var12 != p_Var1) {
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var12[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_1e8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_1e0 = "";
        local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x23d,
                   &local_1f8);
        local_2a8 = (char *)((ulong)local_2a8 & 0xffffffffffffff00);
        local_2b0 = &PTR__lazy_ostream_001fd428;
        sStack_2a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_298 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_330 = (undefined *)CONCAT44(local_330._4_4_,iVar3);
        local_334 = 6;
        local_2f8 = (char *)CONCAT71(local_2f8._1_7_,iVar3 == 6);
        local_2f0 = (char *)0x0;
        sStack_2e8.pi_ = (sp_counted_base *)0x0;
        local_2c0 = (undefined4 **)0x1c3e0d;
        local_2b8 = "";
        local_320 = &local_330;
        local_2d8 = 0;
        local_2e0 = &PTR__lazy_ostream_001fd8e8;
        local_2d0 = &boost::unit_test::lazy_ostream::inst;
        local_2c8 = &local_320;
        local_328 = &local_334;
        local_310 = local_310 & 0xffffffffffffff00;
        local_318 = &PTR__lazy_ostream_001fd928;
        sStack_308.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_300 = &local_328;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2f8,&local_2b0,&local_2c0,0x23d,1,2,2,"entry.get_column_index()",
                   &local_2e0,"6",&local_318);
        boost::detail::shared_count::~shared_count(&sStack_2e8);
      }
    }
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    ppEVar14 = moveCol.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
               .super_type.m_holder.m_start;
  }
  if (moveCol.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
      .super_type.m_holder.m_size != 0) {
    lVar13 = moveCol.column_.
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
             .super_type.m_holder.m_size << 3;
    do {
      if (ppEVar14 == (pointer)0x0) goto LAB_0018de5c;
      pEVar5 = *ppEVar14;
      if ((moveCol.super_Row_access_option.rows_ != (Row_container *)0x0) &&
         (plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
         plVar6 != (node_ptr)0x0)) {
        plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
        plVar7->next_ = plVar6;
        plVar6->prev_ = plVar7;
        (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
        ;
        (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
        ;
      }
      if (pEVar5 != (Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>
                     *)0x0) {
        plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_;
        if (plVar6 != (node_ptr)0x0) {
          plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
          plVar7->next_ = plVar6;
          plVar6->prev_ = plVar7;
          (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ =
               (node_ptr)0x0;
          (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ =
               (node_ptr)0x0;
        }
        operator_delete(pEVar5,0x20);
      }
      ppEVar14 = ppEVar14 + 1;
      lVar13 = lVar13 + -8;
    } while (lVar13 != 0);
  }
  if ((moveCol.column_.
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
       .super_type.m_holder.m_capacity != 0) &&
     (&moveCol.column_.
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
       .m_storage_start !=
      (storage_type *)
      moveCol.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
      .super_type.m_holder.m_start)) {
    operator_delete(moveCol.column_.
                    super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                    .super_type.m_holder.m_start);
  }
  if (col.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
      .super_type.m_holder.m_size != 0) {
    lVar13 = col.column_.
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
             .super_type.m_holder.m_size << 3;
    ppEVar14 = col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
               .super_type.m_holder.m_start;
    do {
      if (ppEVar14 == (pointer)0x0) {
LAB_0018de5c:
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, true>>> **, false>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, true>>> **, IsConst = false]"
                     );
      }
      pEVar5 = *ppEVar14;
      if ((col.super_Row_access_option.rows_ != (Row_container *)0x0) &&
         (plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
         plVar6 != (node_ptr)0x0)) {
        plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
        plVar7->next_ = plVar6;
        plVar6->prev_ = plVar7;
        (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
        ;
        (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
        ;
      }
      if (pEVar5 != (Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>
                     *)0x0) {
        plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_;
        if (plVar6 != (node_ptr)0x0) {
          plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
          plVar7->next_ = plVar6;
          plVar6->prev_ = plVar7;
          (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ =
               (node_ptr)0x0;
          (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ =
               (node_ptr)0x0;
        }
        operator_delete(pEVar5,0x20);
      }
      ppEVar14 = ppEVar14 + 1;
      lVar13 = lVar13 + -8;
    } while (lVar13 != 0);
  }
  if ((col.column_.
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
       .super_type.m_holder.m_capacity != 0) &&
     (&col.column_.
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
       .m_storage_start !=
      (storage_type *)
      col.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
      .super_type.m_holder.m_start)) {
    operator_delete(col.column_.
                    super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
                    .super_type.m_holder.m_start);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}